

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeLateCustomSections(WasmBinaryWriter *this)

{
  CustomSection *pCVar1;
  int iVar2;
  CustomSection *section;
  CustomSection *section_00;
  
  pCVar1 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (section_00 = (this->wasm->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_start; section_00 != pCVar1;
      section_00 = section_00 + 1) {
    iVar2 = std::__cxx11::string::compare((char *)section_00);
    if (iVar2 != 0) {
      writeCustomSection(this,section_00);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeLateCustomSections() {
  for (auto& section : wasm->customSections) {
    if (section.name != BinaryConsts::CustomSections::Dylink) {
      writeCustomSection(section);
    }
  }
}